

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerCompareModeCase::test
          (SamplerCompareModeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLint param;
  uint expected;
  TestLog *pTVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ScopedLogSection section;
  GLint value;
  ScopedLogSection section_1;
  ScopedLogSection local_f0;
  long local_e8;
  TestLog local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  GLuint local_4c;
  code *local_48;
  GLenum local_40;
  ScopedLogSection local_38;
  
  tester = (this->super_SamplerTest).m_tester;
  bVar2 = isPureIntTester(tester);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = isPureUintTester(tester);
  }
  if (bVar3 == false) {
    pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Initial","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar1,&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0,
               (this->super_SamplerTest).m_type);
    tcu::TestLog::endSection(local_f0.m_log);
  }
  pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Set","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar1,&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) {
    lVar10 = 0;
    do {
      param = *(GLint *)((long)&DAT_00b839cc + lVar10);
      glu::CallLogWrapper::glSamplerParameteri
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,param);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar8 = 0xf;
        if (local_90 != local_80) {
          uVar8 = local_80[0];
        }
        if (uVar8 < local_70._M_string_length + local_88) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar9 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_009484fe;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_009484fe:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar1 = (TestLog *)(plVar5 + 2);
        if ((TestLog *)*plVar5 == pTVar1) {
          local_e0.m_log = pTVar1->m_log;
          lStack_d8 = plVar5[3];
        }
        else {
          local_e0.m_log = pTVar1->m_log;
          local_f0.m_log = (TestLog *)*plVar5;
        }
        local_e8 = plVar5[1];
        *plVar5 = (long)pTVar1;
        plVar5[1] = 0;
        *(undefined1 *)&pTVar1->m_log = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_b0._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 param,(this->super_SamplerTest).m_type);
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
    lVar10 = 0;
    do {
      expected = *(uint *)((long)&DAT_00b839cc + lVar10);
      glu::CallLogWrapper::glSamplerParameterf
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (float)expected);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar8 = 0xf;
        if (local_90 != local_80) {
          uVar8 = local_80[0];
        }
        if (uVar8 < local_70._M_string_length + local_88) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar9 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_009487c6;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_009487c6:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar1 = (TestLog *)(plVar5 + 2);
        if ((TestLog *)*plVar5 == pTVar1) {
          local_e0.m_log = pTVar1->m_log;
          lStack_d8 = plVar5[3];
        }
        else {
          local_e0.m_log = pTVar1->m_log;
          local_f0.m_log = (TestLog *)*plVar5;
        }
        local_e8 = plVar5[1];
        *plVar5 = (long)pTVar1;
        plVar5[1] = 0;
        *(undefined1 *)&pTVar1->m_log = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_b0._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 expected,(this->super_SamplerTest).m_type);
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
  }
  else {
    lVar10 = 0;
    do {
      bVar2 = isPureIntTester((this->super_SamplerTest).m_tester);
      if (bVar2) {
        local_4c = *(GLuint *)((long)&DAT_00b839cc + lVar10);
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   (GLint *)&local_4c);
        GVar4 = glu::CallLogWrapper::glGetError(gl);
        if (GVar4 != 0) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar4;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
          uVar8 = 0xf;
          if (local_90 != local_80) {
            uVar8 = local_80[0];
          }
          if (uVar8 < local_70._M_string_length + local_88) {
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              uVar9 = local_70.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_0094802c;
            plVar5 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
          }
          else {
LAB_0094802c:
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
          }
          local_f0.m_log = &local_e0;
          pTVar1 = (TestLog *)(plVar5 + 2);
          if ((TestLog *)*plVar5 == pTVar1) {
            local_e0.m_log = pTVar1->m_log;
            lStack_d8 = plVar5[3];
          }
          else {
            local_e0.m_log = pTVar1->m_log;
            local_f0.m_log = (TestLog *)*plVar5;
          }
          local_e8 = plVar5[1];
          *plVar5 = (long)pTVar1;
          plVar5[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_b0.field_2._M_allocated_capacity = *psVar7;
            local_b0.field_2._8_8_ = plVar5[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar7;
            local_b0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_b0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_d0);
          goto LAB_00948361;
        }
      }
      else {
        local_4c = *(GLuint *)((long)&DAT_00b839cc + lVar10);
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_4c
                  );
        GVar4 = glu::CallLogWrapper::glGetError(gl);
        if (GVar4 == 0) goto LAB_009483f1;
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_48);
        uVar8 = 0xf;
        if (local_90 != local_80) {
          uVar8 = local_80[0];
        }
        if (uVar8 < local_70._M_string_length + local_88) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar9 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_70._M_string_length + local_88) goto LAB_00948125;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
        }
        else {
LAB_00948125:
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar1 = (TestLog *)(plVar5 + 2);
        if ((TestLog *)*plVar5 == pTVar1) {
          local_e0.m_log = pTVar1->m_log;
          lStack_d8 = plVar5[3];
        }
        else {
          local_e0.m_log = pTVar1->m_log;
          local_f0.m_log = (TestLog *)*plVar5;
        }
        local_e8 = plVar5[1];
        *plVar5 = (long)pTVar1;
        plVar5[1] = 0;
        *(undefined1 *)&pTVar1->m_log = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0.field_2._8_8_ = puVar6[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar7;
          local_b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_b0._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar7;
          local_d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_d0);
LAB_00948361:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
      }
LAB_009483f1:
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 *(int *)((long)&DAT_00b839cc + lVar10),(this->super_SamplerTest).m_type);
      lVar10 = lVar10 + 4;
    } while (lVar10 == 4);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void SamplerCompareModeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_NONE, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		const GLenum				modes[]		= {GL_COMPARE_REF_TO_TEXTURE, GL_NONE};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)modes[ndx];
					gl.glSamplerParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = modes[ndx];
					gl.glSamplerParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
				}

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				gl.glSamplerParameteri(m_target, m_pname, modes[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				gl.glSamplerParameterf(m_target, m_pname, (GLfloat)modes[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}
		}
	}
}